

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetAccessors
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,Var getter,
          Var setter,PropertyOperationFlags flags)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  PathTypeHandlerBase *pPVar5;
  DictionaryTypeHandlerBase<unsigned_short> *this_00;
  
  bVar2 = DoConvertToPathType((DynamicType *)(instance->super_RecyclableObject).type.ptr);
  if (bVar2) {
    pPVar5 = ConvertToPathType(this,instance);
    iVar3 = (*(pPVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x34])
                      (pPVar5,instance,(ulong)(uint)propertyId,getter,setter,(ulong)flags);
    return iVar3;
  }
  this_00 = SimpleTypeHandler<6ul>::
            ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                      ((SimpleTypeHandler<6ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  BVar4 = DictionaryTypeHandlerBase<unsigned_short>::SetAccessors
                    (this_00,instance,propertyId,getter,setter,flags);
  return BVar4;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAccessors(DynamicObject* instance, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (DoConvertToPathType(instance->GetDynamicType()))
        {
            return ConvertToPathType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
        else
        {
            // Don't attempt to share cross-site function types
            return ConvertToDictionaryType(instance)->SetAccessors(instance, propertyId, getter, setter, flags);
        }
    }